

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvIntersector1Woop<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Geometry *pGVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_266c;
  int local_2634;
  ulong *local_2630;
  ulong local_2628;
  ulong local_2620;
  RayHit *local_2618;
  RTCIntersectArguments *local_2610;
  long local_2608;
  RayQueryContext *local_2600;
  ulong local_25f8;
  long local_25f0;
  RTCFilterFunctionNArguments local_25e8;
  float local_25b8;
  undefined4 local_25b4;
  undefined4 local_25b0;
  undefined4 local_25ac;
  undefined4 local_25a8;
  undefined4 local_25a4;
  uint local_25a0;
  uint local_259c;
  uint local_2598;
  undefined1 local_2588 [16];
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  byte local_24c8;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  uint uVar27;
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_2600 = context;
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar35 = vpandd_avx512vl((undefined1  [16])aVar3,auVar39);
    auVar36 = vprolq_avx512vl(auVar35,0x20);
    auVar37 = vshufps_avx(auVar35,auVar35,0x4e);
    auVar39 = vmaxss_avx(auVar35,auVar36);
    uVar31 = 2;
    if (auVar37._0_4_ < auVar39._0_4_) {
      uVar31 = (uint)(auVar35._0_4_ <= auVar36._0_4_);
    }
    uVar27 = uVar31 - 2;
    if (uVar31 + 1 < 3) {
      uVar27 = uVar31 + 1;
    }
    uVar26 = uVar27 + 1;
    if (uVar27 + 1 == 3) {
      uVar26 = 0;
    }
    local_2620 = (ulong)uVar31;
    fVar2 = (float)ray->instID[local_2620 - 0xf];
    uVar31 = uVar27;
    if (fVar2 < 0.0) {
      uVar31 = uVar26;
    }
    local_2628 = (ulong)uVar31;
    if (fVar2 < 0.0) {
      uVar26 = uVar27;
    }
    local_25f8 = (ulong)uVar26;
    uVar31 = ray->instID[local_2628 - 0x13];
    auVar66 = ZEXT1664(CONCAT412(uVar31,CONCAT48(uVar31,CONCAT44(uVar31,uVar31))));
    uVar31 = ray->instID[local_25f8 - 0x13];
    auVar67 = ZEXT1664(CONCAT412(uVar31,CONCAT48(uVar31,CONCAT44(uVar31,uVar31))));
    uVar31 = ray->instID[local_2620 - 0x13];
    auVar69 = ZEXT1664(CONCAT412(uVar31,CONCAT48(uVar31,CONCAT44(uVar31,uVar31))));
    auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar37 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,ZEXT416(ray->instID[local_2620 - 0xf]));
    auVar39 = vfnmadd213ss_fma(ZEXT416((uint)fVar2),auVar37,ZEXT416(0x40000000));
    fVar2 = auVar37._0_4_ * auVar39._0_4_;
    local_2630 = local_2368;
    local_2370[0] = 0;
    auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar37 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar38._8_4_ = 0x219392ef;
    auVar38._0_8_ = 0x219392ef219392ef;
    auVar38._12_4_ = 0x219392ef;
    uVar30 = vcmpps_avx512vl(auVar35,auVar38,1);
    bVar8 = (bool)((byte)uVar30 & 1);
    auVar36._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar3.x;
    bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar36._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar3.y;
    bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar36._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar3.z;
    bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar36._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * aVar3.field_3.a;
    auVar38 = vrcp14ps_avx512vl(auVar36);
    auVar35._8_4_ = 0x3f800000;
    auVar35._0_8_ = 0x3f8000003f800000;
    auVar35._12_4_ = 0x3f800000;
    auVar35 = vfnmadd213ps_avx512vl(auVar36,auVar38,auVar35);
    auVar38 = vfmadd132ps_fma(auVar35,auVar38,auVar38);
    auVar44 = vbroadcastss_avx512vl(auVar38);
    auVar71 = ZEXT3264(auVar44);
    auVar35 = vmovshdup_avx(auVar38);
    auVar44 = vbroadcastsd_avx512vl(auVar35);
    auVar72 = ZEXT3264(auVar44);
    auVar48._8_4_ = 2;
    auVar48._0_8_ = 0x200000002;
    auVar48._12_4_ = 2;
    auVar48._16_4_ = 2;
    auVar48._20_4_ = 2;
    auVar48._24_4_ = 2;
    auVar48._28_4_ = 2;
    auVar36 = vshufpd_avx(auVar38,auVar38,1);
    auVar44 = vpermps_avx512vl(auVar48,ZEXT1632(auVar38));
    auVar73 = ZEXT3264(auVar44);
    fVar52 = auVar38._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar44 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar74 = ZEXT3264(auVar44);
    auVar50._4_4_ = fVar52;
    auVar50._0_4_ = fVar52;
    auVar50._8_4_ = fVar52;
    auVar50._12_4_ = fVar52;
    auVar50._16_4_ = fVar52;
    auVar50._20_4_ = fVar52;
    auVar50._24_4_ = fVar52;
    auVar50._28_4_ = fVar52;
    auVar46 = ZEXT1632(CONCAT412(auVar38._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar38._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar38._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar52))
                                ));
    auVar45 = vpermps_avx512vl(auVar44,auVar46);
    auVar44 = vpermps_avx2(auVar48,auVar46);
    uVar32 = (ulong)(auVar38._0_4_ < 0.0) * 0x20;
    uVar30 = (ulong)(auVar35._0_4_ < 0.0) << 5 | 0x40;
    uVar34 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x80;
    uVar63 = auVar37._0_4_;
    auVar56 = ZEXT3264(CONCAT428(uVar63,CONCAT424(uVar63,CONCAT420(uVar63,CONCAT416(uVar63,CONCAT412
                                                  (uVar63,CONCAT48(uVar63,CONCAT44(uVar63,uVar63))))
                                                  ))));
    auVar47._8_4_ = 0x80000000;
    auVar47._0_8_ = 0x8000000080000000;
    auVar47._12_4_ = 0x80000000;
    auVar47._16_4_ = 0x80000000;
    auVar47._20_4_ = 0x80000000;
    auVar47._24_4_ = 0x80000000;
    auVar47._28_4_ = 0x80000000;
    auVar46 = vxorps_avx512vl(auVar50,auVar47);
    auVar75 = ZEXT3264(auVar46);
    auVar45 = vxorps_avx512vl(auVar45,auVar47);
    auVar76 = ZEXT3264(auVar45);
    auVar44 = vxorps_avx512vl(auVar44,auVar47);
    auVar77 = ZEXT3264(auVar44);
    auVar44 = vbroadcastss_avx512vl(auVar39);
    auVar78 = ZEXT3264(auVar44);
    auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * (float)ray->instID[local_2628 - 0xf])));
    auVar79 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * (float)ray->instID[local_25f8 - 0xf])));
    auVar80 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)fVar2));
    auVar81 = ZEXT1664(auVar39);
    auVar44 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar82 = ZEXT3264(auVar44);
    auVar44 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar83 = ZEXT3264(auVar44);
    auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar84 = ZEXT1664(auVar39);
    auVar44 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar85 = ZEXT3264(auVar44);
    auVar44 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar86 = ZEXT3264(auVar44);
    local_2618 = ray;
    do {
      pfVar1 = (float *)(local_2630 + -1);
      local_2630 = local_2630 + -2;
      if (*pfVar1 <= (local_2618->super_RayK<1>).tfar) {
        uVar33 = *local_2630;
        while ((uVar33 & 8) == 0) {
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar32),auVar75._0_32_,
                               auVar71._0_32_);
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar30),auVar76._0_32_,
                               auVar72._0_32_);
          auVar44 = vpmaxsd_avx2(auVar44,auVar45);
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar34),auVar77._0_32_,
                               auVar73._0_32_);
          auVar45 = vpmaxsd_avx512vl(auVar45,auVar78._0_32_);
          auVar44 = vpmaxsd_avx2(auVar44,auVar45);
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar32 ^ 0x20)),
                               auVar75._0_32_,auVar71._0_32_);
          auVar46 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar30 ^ 0x20)),
                               auVar76._0_32_,auVar72._0_32_);
          auVar45 = vpminsd_avx2(auVar45,auVar46);
          auVar46 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar33 + 0x40 + (uVar34 ^ 0x20)),
                               auVar77._0_32_,auVar73._0_32_);
          auVar46 = vpminsd_avx2(auVar46,auVar56._0_32_);
          auVar45 = vpminsd_avx2(auVar45,auVar46);
          uVar29 = vpcmpd_avx512vl(auVar44,auVar45,2);
          bVar23 = (byte)uVar29;
          if (bVar23 == 0) goto LAB_01f1cd78;
          auVar45 = *(undefined1 (*) [32])(uVar33 & 0xfffffffffffffff0);
          auVar46 = ((undefined1 (*) [32])(uVar33 & 0xfffffffffffffff0))[1];
          auVar47 = vmovdqa64_avx512vl(auVar82._0_32_);
          auVar47 = vpternlogd_avx512vl(auVar47,auVar44,auVar83._0_32_,0xf8);
          auVar48 = vpcompressd_avx512vl(auVar47);
          auVar49._0_4_ =
               (uint)(bVar23 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar47._0_4_;
          bVar8 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar49._4_4_ = (uint)bVar8 * auVar48._4_4_ | (uint)!bVar8 * auVar47._4_4_;
          bVar8 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar49._8_4_ = (uint)bVar8 * auVar48._8_4_ | (uint)!bVar8 * auVar47._8_4_;
          bVar8 = (bool)((byte)(uVar29 >> 3) & 1);
          auVar49._12_4_ = (uint)bVar8 * auVar48._12_4_ | (uint)!bVar8 * auVar47._12_4_;
          bVar8 = (bool)((byte)(uVar29 >> 4) & 1);
          auVar49._16_4_ = (uint)bVar8 * auVar48._16_4_ | (uint)!bVar8 * auVar47._16_4_;
          bVar8 = (bool)((byte)(uVar29 >> 5) & 1);
          auVar49._20_4_ = (uint)bVar8 * auVar48._20_4_ | (uint)!bVar8 * auVar47._20_4_;
          bVar8 = (bool)((byte)(uVar29 >> 6) & 1);
          auVar49._24_4_ = (uint)bVar8 * auVar48._24_4_ | (uint)!bVar8 * auVar47._24_4_;
          bVar8 = SUB81(uVar29 >> 7,0);
          auVar49._28_4_ = (uint)bVar8 * auVar48._28_4_ | (uint)!bVar8 * auVar47._28_4_;
          auVar47 = vpermt2q_avx512vl(auVar45,auVar49,auVar46);
          uVar33 = auVar47._0_8_;
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 != 0) {
            auVar47 = vpshufd_avx2(auVar49,0x55);
            vpermt2q_avx512vl(auVar45,auVar47,auVar46);
            auVar48 = vpminsd_avx2(auVar49,auVar47);
            auVar47 = vpmaxsd_avx2(auVar49,auVar47);
            bVar23 = bVar23 - 1 & bVar23;
            if (bVar23 == 0) {
              auVar48 = vpermi2q_avx512vl(auVar48,auVar45,auVar46);
              uVar33 = auVar48._0_8_;
              auVar45 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
              *local_2630 = auVar45._0_8_;
              auVar44 = vpermd_avx2(auVar47,auVar44);
              *(int *)(local_2630 + 1) = auVar44._0_4_;
              local_2630 = local_2630 + 2;
            }
            else {
              auVar51 = vpshufd_avx2(auVar49,0xaa);
              vpermt2q_avx512vl(auVar45,auVar51,auVar46);
              auVar50 = vpminsd_avx2(auVar48,auVar51);
              auVar48 = vpmaxsd_avx2(auVar48,auVar51);
              auVar51 = vpminsd_avx2(auVar47,auVar48);
              auVar47 = vpmaxsd_avx2(auVar47,auVar48);
              bVar23 = bVar23 - 1 & bVar23;
              if (bVar23 == 0) {
                auVar48 = vpermi2q_avx512vl(auVar50,auVar45,auVar46);
                uVar33 = auVar48._0_8_;
                auVar48 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                *local_2630 = auVar48._0_8_;
                auVar47 = vpermd_avx2(auVar47,auVar44);
                *(int *)(local_2630 + 1) = auVar47._0_4_;
                auVar45 = vpermt2q_avx512vl(auVar45,auVar51,auVar46);
                local_2630[2] = auVar45._0_8_;
                auVar44 = vpermd_avx2(auVar51,auVar44);
                *(int *)(local_2630 + 3) = auVar44._0_4_;
                local_2630 = local_2630 + 4;
              }
              else {
                auVar48 = vpshufd_avx2(auVar49,0xff);
                vpermt2q_avx512vl(auVar45,auVar48,auVar46);
                auVar13 = vpminsd_avx2(auVar50,auVar48);
                auVar48 = vpmaxsd_avx2(auVar50,auVar48);
                auVar50 = vpminsd_avx2(auVar51,auVar48);
                auVar48 = vpmaxsd_avx2(auVar51,auVar48);
                auVar51 = vpminsd_avx2(auVar47,auVar48);
                auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                bVar23 = bVar23 - 1 & bVar23;
                if (bVar23 == 0) {
                  auVar48 = vpermi2q_avx512vl(auVar13,auVar45,auVar46);
                  uVar33 = auVar48._0_8_;
                  auVar48 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                  *local_2630 = auVar48._0_8_;
                  auVar47 = vpermd_avx2(auVar47,auVar44);
                  *(int *)(local_2630 + 1) = auVar47._0_4_;
                  auVar47 = vpermt2q_avx512vl(auVar45,auVar51,auVar46);
                  local_2630[2] = auVar47._0_8_;
                  auVar47 = vpermd_avx2(auVar51,auVar44);
                  *(int *)(local_2630 + 3) = auVar47._0_4_;
                  auVar45 = vpermt2q_avx512vl(auVar45,auVar50,auVar46);
                  local_2630[4] = auVar45._0_8_;
                  auVar44 = vpermd_avx2(auVar50,auVar44);
                  *(int *)(local_2630 + 5) = auVar44._0_4_;
                  local_2630 = local_2630 + 6;
                }
                else {
                  auVar49 = valignd_avx512vl(auVar49,auVar49,3);
                  auVar48 = vmovdqa64_avx512vl(auVar84._0_32_);
                  auVar48 = vpermt2d_avx512vl(auVar48,auVar85._0_32_,auVar13);
                  auVar48 = vpermt2d_avx512vl(auVar48,auVar86._0_32_,auVar50);
                  auVar50 = vpermt2d_avx512vl(auVar48,auVar86._0_32_,auVar51);
                  auVar48 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar47 = vpermt2d_avx512vl(auVar50,auVar48,auVar47);
                  auVar70 = ZEXT3264(auVar47);
                  bVar25 = bVar23;
                  do {
                    auVar48 = auVar70._0_32_;
                    auVar47 = vpermps_avx512vl(auVar74._0_32_,auVar49);
                    auVar49 = valignd_avx512vl(auVar49,auVar49,1);
                    vpermt2q_avx512vl(auVar45,auVar49,auVar46);
                    bVar25 = bVar25 - 1 & bVar25;
                    uVar19 = vpcmpd_avx512vl(auVar47,auVar48,5);
                    auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                    bVar20 = (byte)uVar19 << 1;
                    auVar48 = valignd_avx512vl(auVar48,auVar48,7);
                    bVar8 = (bool)((byte)uVar19 & 1);
                    auVar51._4_4_ = (uint)bVar8 * auVar48._4_4_ | (uint)!bVar8 * auVar47._4_4_;
                    auVar51._0_4_ = auVar47._0_4_;
                    bVar8 = (bool)(bVar20 >> 2 & 1);
                    auVar51._8_4_ = (uint)bVar8 * auVar48._8_4_ | (uint)!bVar8 * auVar47._8_4_;
                    bVar8 = (bool)(bVar20 >> 3 & 1);
                    auVar51._12_4_ = (uint)bVar8 * auVar48._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                    bVar8 = (bool)(bVar20 >> 4 & 1);
                    auVar51._16_4_ = (uint)bVar8 * auVar48._16_4_ | (uint)!bVar8 * auVar47._16_4_;
                    bVar8 = (bool)(bVar20 >> 5 & 1);
                    auVar51._20_4_ = (uint)bVar8 * auVar48._20_4_ | (uint)!bVar8 * auVar47._20_4_;
                    bVar8 = (bool)(bVar20 >> 6 & 1);
                    auVar51._24_4_ = (uint)bVar8 * auVar48._24_4_ | (uint)!bVar8 * auVar47._24_4_;
                    auVar51._28_4_ =
                         (uint)(bVar20 >> 7) * auVar48._28_4_ |
                         (uint)!(bool)(bVar20 >> 7) * auVar47._28_4_;
                    auVar70 = ZEXT3264(auVar51);
                  } while (bVar25 != 0);
                  lVar24 = (ulong)(uint)POPCOUNT((uint)bVar23) + 3;
                  do {
                    auVar47 = vpermi2q_avx512vl(auVar51,auVar45,auVar46);
                    *local_2630 = auVar47._0_8_;
                    auVar48 = auVar70._0_32_;
                    auVar47 = vpermd_avx2(auVar48,auVar44);
                    *(int *)(local_2630 + 1) = auVar47._0_4_;
                    auVar51 = valignd_avx512vl(auVar48,auVar48,1);
                    local_2630 = local_2630 + 2;
                    auVar70 = ZEXT3264(auVar51);
                    lVar24 = lVar24 + -1;
                  } while (lVar24 != 0);
                  auVar44 = vpermt2q_avx512vl(auVar45,auVar51,auVar46);
                  uVar33 = auVar44._0_8_;
                }
                auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
              }
            }
          }
        }
        local_25f0 = (ulong)((uint)uVar33 & 0xf) - 8;
        if (local_25f0 != 0) {
          local_2608 = 0;
          do {
            pauVar28 = (undefined1 (*) [16])(local_2608 * 0xb0 + (uVar33 & 0xfffffffffffffff0));
            auVar40 = auVar66._0_16_;
            auVar39 = vsubps_avx(pauVar28[local_2628],auVar40);
            auVar41 = auVar67._0_16_;
            auVar37 = vsubps_avx(pauVar28[local_25f8],auVar41);
            auVar68 = auVar69._0_16_;
            auVar35 = vsubps_avx(pauVar28[local_2620],auVar68);
            auVar36 = vsubps_avx(pauVar28[local_2628 + 3],auVar40);
            auVar38 = vsubps_avx(pauVar28[local_25f8 + 3],auVar41);
            auVar12 = vsubps_avx(pauVar28[local_2620 + 3],auVar68);
            auVar40 = vsubps_avx(pauVar28[local_2628 + 6],auVar40);
            auVar41 = vsubps_avx(pauVar28[local_25f8 + 6],auVar41);
            auVar68 = vsubps_avx(pauVar28[local_2620 + 6],auVar68);
            auVar53 = auVar79._0_16_;
            auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar35,auVar53);
            auVar57 = auVar80._0_16_;
            auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar35,auVar57);
            auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar12,auVar53);
            auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar12,auVar57);
            auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar68,auVar53);
            auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar68,auVar57);
            auVar53._0_4_ = auVar38._0_4_ * auVar40._0_4_;
            auVar53._4_4_ = auVar38._4_4_ * auVar40._4_4_;
            auVar53._8_4_ = auVar38._8_4_ * auVar40._8_4_;
            auVar53._12_4_ = auVar38._12_4_ * auVar40._12_4_;
            auVar57._0_4_ = auVar36._0_4_ * auVar41._0_4_;
            auVar57._4_4_ = auVar36._4_4_ * auVar41._4_4_;
            auVar57._8_4_ = auVar36._8_4_ * auVar41._8_4_;
            auVar57._12_4_ = auVar36._12_4_ * auVar41._12_4_;
            auVar58._0_4_ = auVar39._0_4_ * auVar41._0_4_;
            auVar58._4_4_ = auVar39._4_4_ * auVar41._4_4_;
            auVar58._8_4_ = auVar39._8_4_ * auVar41._8_4_;
            auVar58._12_4_ = auVar39._12_4_ * auVar41._12_4_;
            auVar41._0_4_ = auVar37._0_4_ * auVar40._0_4_;
            auVar41._4_4_ = auVar37._4_4_ * auVar40._4_4_;
            auVar41._8_4_ = auVar37._8_4_ * auVar40._8_4_;
            auVar41._12_4_ = auVar37._12_4_ * auVar40._12_4_;
            auVar40._0_4_ = auVar37._0_4_ * auVar36._0_4_;
            auVar40._4_4_ = auVar37._4_4_ * auVar36._4_4_;
            auVar40._8_4_ = auVar37._8_4_ * auVar36._8_4_;
            auVar40._12_4_ = auVar37._12_4_ * auVar36._12_4_;
            auVar37._0_4_ = auVar39._0_4_ * auVar38._0_4_;
            auVar37._4_4_ = auVar39._4_4_ * auVar38._4_4_;
            auVar37._8_4_ = auVar39._8_4_ * auVar38._8_4_;
            auVar37._12_4_ = auVar39._12_4_ * auVar38._12_4_;
            uVar19 = vcmpps_avx512vl(auVar53,auVar57,5);
            uVar14 = vcmpps_avx512vl(auVar40,auVar37,5);
            uVar15 = vcmpps_avx512vl(auVar58,auVar41,5);
            uVar16 = vcmpps_avx512vl(auVar53,auVar57,2);
            uVar17 = vcmpps_avx512vl(auVar40,auVar37,2);
            uVar18 = vcmpps_avx512vl(auVar58,auVar41,2);
            local_24c8 = ((byte)uVar19 & (byte)uVar14 & (byte)uVar15 |
                         (byte)uVar16 & (byte)uVar17 & (byte)uVar18) & 0xf;
            if (local_24c8 != 0) {
              local_2508 = vsubps_avx(auVar53,auVar57);
              local_24f8 = vsubps_avx(auVar58,auVar41);
              auVar39 = vsubps_avx(auVar40,auVar37);
              auVar59._0_4_ = auVar39._0_4_ + local_2508._0_4_ + local_24f8._0_4_;
              auVar59._4_4_ = auVar39._4_4_ + local_2508._4_4_ + local_24f8._4_4_;
              auVar59._8_4_ = auVar39._8_4_ + local_2508._8_4_ + local_24f8._8_4_;
              auVar59._12_4_ = auVar39._12_4_ + local_2508._12_4_ + local_24f8._12_4_;
              uVar19 = vcmpps_avx512vl(auVar59,auVar70._0_16_,4);
              auVar37 = vrcp14ps_avx512vl(auVar59);
              auVar21._8_4_ = 0x3f800000;
              auVar21._0_8_ = 0x3f8000003f800000;
              auVar21._12_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_avx512vl(auVar59,auVar37,auVar21);
              local_24d8 = vfmadd132ps_fma(auVar36,auVar37,auVar37);
              auVar36 = auVar81._0_16_;
              auVar37 = vmulps_avx512vl(auVar36,auVar35);
              auVar35 = vmulps_avx512vl(auVar36,auVar12);
              auVar36 = vmulps_avx512vl(auVar36,auVar68);
              auVar61._0_4_ = auVar39._0_4_ * auVar36._0_4_;
              auVar61._4_4_ = auVar39._4_4_ * auVar36._4_4_;
              auVar61._8_4_ = auVar39._8_4_ * auVar36._8_4_;
              auVar61._12_4_ = auVar39._12_4_ * auVar36._12_4_;
              auVar39 = vfmadd231ps_fma(auVar61,local_24f8,auVar35);
              auVar39 = vfmadd231ps_fma(auVar39,local_2508,auVar37);
              fVar52 = local_24d8._0_4_;
              local_24e8._0_4_ = auVar39._0_4_ * fVar52;
              fVar9 = local_24d8._4_4_;
              local_24e8._4_4_ = auVar39._4_4_ * fVar9;
              fVar10 = local_24d8._8_4_;
              local_24e8._8_4_ = auVar39._8_4_ * fVar10;
              fVar11 = local_24d8._12_4_;
              local_24e8._12_4_ = auVar39._12_4_ * fVar11;
              auVar56 = ZEXT1664(local_24e8);
              uVar63 = *(undefined4 *)((long)&(local_2618->super_RayK<1>).org.field_0 + 0xc);
              auVar12._4_4_ = uVar63;
              auVar12._0_4_ = uVar63;
              auVar12._8_4_ = uVar63;
              auVar12._12_4_ = uVar63;
              uVar14 = vcmpps_avx512vl(local_24e8,auVar12,0xe);
              fVar2 = (local_2618->super_RayK<1>).tfar;
              auVar68._4_4_ = fVar2;
              auVar68._0_4_ = fVar2;
              auVar68._8_4_ = fVar2;
              auVar68._12_4_ = fVar2;
              uVar15 = vcmpps_avx512vl(local_24e8,auVar68,2);
              local_24c8 = (byte)uVar19 & (byte)uVar14 & (byte)uVar15 & local_24c8;
              if (local_24c8 != 0) {
                auVar4._0_4_ = (local_2618->super_RayK<1>).tfar;
                auVar4._4_4_ = (local_2618->super_RayK<1>).mask;
                auVar4._8_4_ = (local_2618->super_RayK<1>).id;
                auVar4._12_4_ = (local_2618->super_RayK<1>).flags;
                auVar65 = ZEXT1664(auVar4);
                uVar31 = vextractps_avx(auVar4,1);
                auVar39 = vsubps_avx(pauVar28[6],*pauVar28);
                auVar37 = vsubps_avx(pauVar28[7],pauVar28[1]);
                auVar35 = vsubps_avx(pauVar28[8],pauVar28[2]);
                auVar36 = vsubps_avx(*pauVar28,pauVar28[3]);
                auVar38 = vsubps_avx(pauVar28[1],pauVar28[4]);
                auVar12 = vsubps_avx(pauVar28[2],pauVar28[5]);
                auVar64._0_4_ = auVar35._0_4_ * auVar38._0_4_;
                auVar64._4_4_ = auVar35._4_4_ * auVar38._4_4_;
                auVar64._8_4_ = auVar35._8_4_ * auVar38._8_4_;
                auVar64._12_4_ = auVar35._12_4_ * auVar38._12_4_;
                local_2488 = vfmsub231ps_fma(auVar64,auVar37,auVar12);
                auVar62._0_4_ = auVar12._0_4_ * auVar39._0_4_;
                auVar62._4_4_ = auVar12._4_4_ * auVar39._4_4_;
                auVar62._8_4_ = auVar12._8_4_ * auVar39._8_4_;
                auVar62._12_4_ = auVar12._12_4_ * auVar39._12_4_;
                local_2478 = vfmsub231ps_fma(auVar62,auVar36,auVar35);
                auVar60._0_4_ = auVar36._0_4_ * auVar37._0_4_;
                auVar60._4_4_ = auVar36._4_4_ * auVar37._4_4_;
                auVar60._8_4_ = auVar36._8_4_ * auVar37._8_4_;
                auVar60._12_4_ = auVar36._12_4_ * auVar37._12_4_;
                local_2468 = vfmsub231ps_fma(auVar60,auVar39,auVar38);
                local_2498 = local_24e8;
                local_24b8[0] = local_2508._0_4_ * fVar52;
                local_24b8[1] = local_2508._4_4_ * fVar9;
                local_24b8[2] = local_2508._8_4_ * fVar10;
                local_24b8[3] = local_2508._12_4_ * fVar11;
                local_24a8[0] = fVar52 * local_24f8._0_4_;
                local_24a8[1] = fVar9 * local_24f8._4_4_;
                local_24a8[2] = fVar10 * local_24f8._8_4_;
                local_24a8[3] = fVar11 * local_24f8._12_4_;
                pSVar6 = local_2600->scene;
                auVar54._8_4_ = 0x7f800000;
                auVar54._0_8_ = 0x7f8000007f800000;
                auVar54._12_4_ = 0x7f800000;
                auVar39 = vblendmps_avx512vl(auVar54,local_24e8);
                auVar42._0_4_ =
                     (uint)(local_24c8 & 1) * auVar39._0_4_ |
                     (uint)!(bool)(local_24c8 & 1) * 0x7f800000;
                bVar8 = (bool)(local_24c8 >> 1 & 1);
                auVar42._4_4_ = (uint)bVar8 * auVar39._4_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_24c8 >> 2 & 1);
                auVar42._8_4_ = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * 0x7f800000;
                auVar42._12_4_ =
                     (uint)(local_24c8 >> 3) * auVar39._12_4_ |
                     (uint)!(bool)(local_24c8 >> 3) * 0x7f800000;
                auVar39 = vshufps_avx(auVar42,auVar42,0xb1);
                auVar39 = vminps_avx(auVar39,auVar42);
                auVar37 = vshufpd_avx(auVar39,auVar39,1);
                auVar39 = vminps_avx(auVar37,auVar39);
                uVar19 = vcmpps_avx512vl(auVar42,auVar39,0);
                local_266c = (uint)local_24c8;
                bVar23 = local_24c8;
                if (((byte)uVar19 & local_24c8) != 0) {
                  bVar23 = (byte)uVar19 & local_24c8;
                }
                uVar27 = 0;
                for (uVar26 = (uint)bVar23; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                  uVar27 = uVar27 + 1;
                }
                do {
                  local_2538 = auVar69._0_16_;
                  local_2528 = auVar67._0_16_;
                  local_2518 = auVar66._0_16_;
                  local_2588 = auVar65._0_16_;
                  local_2578 = auVar56._0_16_;
                  uVar26 = uVar27 & 0xff;
                  local_25a0 = *(uint *)(pauVar28[9] + (ulong)uVar26 * 4);
                  pGVar7 = (pSVar6->geometries).items[local_25a0].ptr;
                  if ((pGVar7->mask & uVar31) == 0) {
                    bVar23 = ~(byte)(1 << (uVar27 & 0x1f)) & (byte)local_266c;
                  }
                  else {
                    local_2610 = local_2600->args;
                    local_2568 = auVar81._0_16_;
                    local_2558 = auVar80._0_16_;
                    local_2548 = auVar79._0_16_;
                    local_2458 = auVar78._0_32_;
                    local_2438 = auVar77._0_32_;
                    local_2418 = auVar76._0_32_;
                    local_23f8 = auVar75._0_32_;
                    local_23d8 = auVar73._0_32_;
                    local_23b8 = auVar72._0_32_;
                    local_2398 = auVar71._0_32_;
                    if (local_2600->args->filter == (RTCFilterFunctionN)0x0) {
                      local_25e8.context = local_2600->user;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar29 = (ulong)(uVar26 << 2);
                        fVar2 = *(float *)((long)local_24b8 + uVar29);
                        fVar52 = *(float *)((long)local_24a8 + uVar29);
                        (local_2618->super_RayK<1>).tfar = *(float *)(local_2498 + uVar29);
                        (local_2618->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar29);
                        (local_2618->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar29);
                        (local_2618->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar29);
                        local_2618->u = fVar2;
                        local_2618->v = fVar52;
                        local_2618->primID = *(uint *)(pauVar28[10] + uVar29);
                        local_2618->geomID = local_25a0;
                        local_2618->instID[0] = (local_25e8.context)->instID[0];
                        local_2618->instPrimID[0] = (local_25e8.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_25e8.context = local_2600->user;
                    }
                    uVar29 = (ulong)(uVar26 * 4);
                    local_25b8 = *(float *)(local_2488 + uVar29);
                    local_25b4 = *(undefined4 *)(local_2478 + uVar29);
                    local_25b0 = *(undefined4 *)(local_2468 + uVar29);
                    local_25ac = *(undefined4 *)((long)local_24b8 + uVar29);
                    local_25a8 = *(undefined4 *)((long)local_24a8 + uVar29);
                    local_25a4 = *(undefined4 *)(pauVar28[10] + uVar29);
                    local_259c = (local_25e8.context)->instID[0];
                    local_2598 = (local_25e8.context)->instPrimID[0];
                    (local_2618->super_RayK<1>).tfar = *(float *)(local_2498 + uVar29);
                    local_2634 = -1;
                    local_25e8.valid = &local_2634;
                    local_25e8.geometryUserPtr = pGVar7->userPtr;
                    local_25e8.ray = (RTCRayN *)local_2618;
                    local_25e8.hit = (RTCHitN *)&local_25b8;
                    local_25e8.N = 1;
                    if (((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar7->intersectionFilterN)(&local_25e8), *local_25e8.valid != 0)) &&
                       ((local_2610->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_2610->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((pGVar7->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_2610->filter)(&local_25e8), *local_25e8.valid != 0)))))) {
                      (((Vec3f *)((long)local_25e8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25e8.hit;
                      (((Vec3f *)((long)local_25e8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25e8.hit + 4);
                      (((Vec3f *)((long)local_25e8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25e8.hit + 8);
                      *(float *)((long)local_25e8.ray + 0x3c) = *(float *)(local_25e8.hit + 0xc);
                      *(float *)((long)local_25e8.ray + 0x40) = *(float *)(local_25e8.hit + 0x10);
                      *(float *)((long)local_25e8.ray + 0x44) = *(float *)(local_25e8.hit + 0x14);
                      *(float *)((long)local_25e8.ray + 0x48) = *(float *)(local_25e8.hit + 0x18);
                      *(float *)((long)local_25e8.ray + 0x4c) = *(float *)(local_25e8.hit + 0x1c);
                      *(float *)((long)local_25e8.ray + 0x50) = *(float *)(local_25e8.hit + 0x20);
                    }
                    else {
                      (local_2618->super_RayK<1>).tfar = (float)local_2588._0_4_;
                    }
                    auVar5._0_4_ = (local_2618->super_RayK<1>).tfar;
                    auVar5._4_4_ = (local_2618->super_RayK<1>).mask;
                    auVar5._8_4_ = (local_2618->super_RayK<1>).id;
                    auVar5._12_4_ = (local_2618->super_RayK<1>).flags;
                    auVar65 = ZEXT1664(auVar5);
                    auVar56 = ZEXT1664(local_2578);
                    fVar2 = (local_2618->super_RayK<1>).tfar;
                    auVar22._4_4_ = fVar2;
                    auVar22._0_4_ = fVar2;
                    auVar22._8_4_ = fVar2;
                    auVar22._12_4_ = fVar2;
                    uVar19 = vcmpps_avx512vl(local_2578,auVar22,2);
                    bVar23 = ~(byte)(1 << (uVar27 & 0x1f)) & (byte)local_266c & (byte)uVar19;
                    uVar31 = vextractps_avx(auVar5,1);
                    auVar66 = ZEXT1664(local_2518);
                    auVar67 = ZEXT1664(local_2528);
                    auVar69 = ZEXT1664(local_2538);
                    auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar71 = ZEXT3264(local_2398);
                    auVar72 = ZEXT3264(local_23b8);
                    auVar73 = ZEXT3264(local_23d8);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar74 = ZEXT3264(auVar44);
                    auVar75 = ZEXT3264(local_23f8);
                    auVar76 = ZEXT3264(local_2418);
                    auVar77 = ZEXT3264(local_2438);
                    auVar78 = ZEXT3264(local_2458);
                    auVar79 = ZEXT1664(local_2548);
                    auVar80 = ZEXT1664(local_2558);
                    auVar81 = ZEXT1664(local_2568);
                    auVar44 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar82 = ZEXT3264(auVar44);
                    auVar44 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar83 = ZEXT3264(auVar44);
                    auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar84 = ZEXT1664(auVar39);
                    auVar44 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar85 = ZEXT3264(auVar44);
                    auVar44 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                    auVar86 = ZEXT3264(auVar44);
                  }
                  local_266c = (uint)bVar23;
                  if (bVar23 == 0) break;
                  auVar55._8_4_ = 0x7f800000;
                  auVar55._0_8_ = 0x7f8000007f800000;
                  auVar55._12_4_ = 0x7f800000;
                  auVar39 = vblendmps_avx512vl(auVar55,auVar56._0_16_);
                  auVar43._0_4_ =
                       (uint)(bVar23 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
                  bVar8 = (bool)(bVar23 >> 1 & 1);
                  auVar43._4_4_ = (uint)bVar8 * auVar39._4_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)(bVar23 >> 2 & 1);
                  auVar43._8_4_ = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * 0x7f800000;
                  auVar43._12_4_ =
                       (uint)(bVar23 >> 3) * auVar39._12_4_ |
                       (uint)!(bool)(bVar23 >> 3) * 0x7f800000;
                  auVar39 = vshufps_avx(auVar43,auVar43,0xb1);
                  auVar39 = vminps_avx(auVar39,auVar43);
                  auVar37 = vshufpd_avx(auVar39,auVar39,1);
                  auVar39 = vminps_avx(auVar37,auVar39);
                  uVar19 = vcmpps_avx512vl(auVar43,auVar39,0);
                  bVar23 = (byte)uVar19 & bVar23;
                  uVar26 = local_266c;
                  if (bVar23 != 0) {
                    uVar26 = (uint)bVar23;
                  }
                  uVar27 = 0;
                  for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                    uVar27 = uVar27 + 1;
                  }
                } while( true );
              }
            }
            local_2608 = local_2608 + 1;
          } while (local_2608 != local_25f0);
        }
        fVar2 = (local_2618->super_RayK<1>).tfar;
        auVar56 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412
                                                  (fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))))
        ;
      }
LAB_01f1cd78:
    } while (local_2630 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }